

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int g_write(lua_State *L,FILE *f,int arg)

{
  FILE *__stream;
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  bool local_5a;
  bool local_59;
  int local_44;
  char *s;
  size_t l;
  int len;
  int status;
  int nargs;
  int arg_local;
  FILE *f_local;
  lua_State *L_local;
  
  status = arg;
  _nargs = (FILE *)f;
  f_local = (FILE *)L;
  iVar1 = lua_gettop(L);
  len = iVar1 - status;
  l._4_4_ = 1;
  while (len != 0) {
    len = len + -1;
    iVar1 = lua_type((lua_State *)f_local,status);
    if (iVar1 == 3) {
      iVar1 = lua_isinteger((lua_State *)f_local,status);
      __stream = _nargs;
      if (iVar1 == 0) {
        lua_tonumberx((lua_State *)f_local,status,(int *)0x0);
        local_44 = fprintf(__stream,"%.14g");
      }
      else {
        lVar2 = lua_tointegerx((lua_State *)f_local,status,(int *)0x0);
        local_44 = fprintf(__stream,"%lld",lVar2);
      }
      l._0_4_ = local_44;
      local_59 = l._4_4_ != 0 && 0 < local_44;
    }
    else {
      pcVar3 = luaL_checklstring((lua_State *)f_local,status,(size_t *)&s);
      local_5a = false;
      local_59 = local_5a;
      if (l._4_4_ != 0) {
        pcVar3 = (char *)fwrite(pcVar3,1,(size_t)s,_nargs);
        local_59 = pcVar3 == s;
      }
    }
    l._4_4_ = (uint)local_59;
    status = status + 1;
  }
  if (l._4_4_ == 0) {
    len = len + -1;
    L_local._4_4_ = luaL_fileresult((lua_State *)f_local,0,(char *)0x0);
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  int status = 1;
  for (; nargs--; arg++) {
    if (lua_type(L, arg) == LUA_TNUMBER) {
      /* optimization: could be done exactly as for strings */
      int len = lua_isinteger(L, arg)
                ? fprintf(f, LUA_INTEGER_FMT,
                             (LUAI_UACINT)lua_tointeger(L, arg))
                : fprintf(f, LUA_NUMBER_FMT,
                             (LUAI_UACNUMBER)lua_tonumber(L, arg));
      status = status && (len > 0);
    }
    else {
      size_t l;
      const char *s = luaL_checklstring(L, arg, &l);
      status = status && (fwrite(s, sizeof(char), l, f) == l);
    }
  }
  if (status) return 1;  /* file handle already on stack top */
  else return luaL_fileresult(L, status, NULL);
}